

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::Generators::RandomFloatingGenerator<long_double>::RandomFloatingGenerator
          (RandomFloatingGenerator<long_double> *this,longdouble a,longdouble b,uint32_t seed)

{
  IGenerator<long_double> *in_RDI;
  unkbyte10 in_stack_00000008;
  RandomFloatingGenerator<long_double> *in_stack_ffffffffffffffc0;
  uint *args_2;
  undefined2 uVar1;
  undefined6 in_stack_fffffffffffffff2;
  IGenerator<long_double> *args;
  
  args_2 = (uint *)in_stack_00000008;
  uVar1 = (undefined2)((unkuint10)in_stack_00000008 >> 0x40);
  args = in_RDI;
  IGenerator<long_double>::IGenerator(in_RDI);
  (in_RDI->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase = (_func_int **)&PTR_next_002a61f0
  ;
  Catch::Detail::
  make_unique<Catch::Generators::RandomFloatingGenerator<long_double>::PImpl,long_double&,long_double&,unsigned_int&>
            ((longdouble *)args,(longdouble *)CONCAT62(in_stack_fffffffffffffff2,uVar1),args_2);
  next(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

RandomFloatingGenerator<long double>::RandomFloatingGenerator(
            long double a, long double b, std::uint32_t seed) :
            m_pimpl(Catch::Detail::make_unique<PImpl>(a, b, seed)) {
            static_cast<void>( next() );
        }